

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void simd::AbsoluteDifference
               (Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
               uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t width,
               uint32_t height,SIMDType simdType)

{
  uint32_t rowSizeIn1;
  uint32_t rowSizeIn2;
  uint32_t rowSizeOut;
  byte bVar1;
  SIMDType SVar2;
  undefined4 in_register_00000014;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  uint simdWidth;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  uint8_t *outY;
  uint uVar3;
  uint32_t local_c4;
  uint local_c0;
  uint local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  local_a0 = CONCAT44(in_register_0000008c,startY2);
  local_b0 = CONCAT44(in_register_00000084,startX2);
  local_b8 = CONCAT44(in_register_00000034,startX1);
  local_a8 = CONCAT44(in_register_00000014,startY1);
  local_98 = (ulong)height;
  local_90 = (ulong)startYOut;
  local_88 = (ulong)startXOut;
  do {
    SVar2 = simdType;
    bVar1 = Image_Function::CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                      (in1,in2,out);
    local_c4 = (uint32_t)local_98;
    if (SVar2 != avx_function) {
      if (SVar2 - sse_function < 2) {
        local_c0 = 0x10;
        if (0xf < bVar1 * width) goto LAB_0012ff5b;
      }
      else if (SVar2 != cpu_function) {
        local_c0 = 0;
        goto LAB_0012ff5b;
      }
      Image_Function::AbsoluteDifference
                (in1,(uint32_t)local_b8,(uint32_t)local_a8,in2,(uint32_t)local_b0,(uint32_t)local_a0
                 ,out,startXOut,startYOut,width,height);
      return;
    }
    simdType = sse_function;
  } while (bVar1 * width < 0x20);
  local_c0 = 0x20;
LAB_0012ff5b:
  uVar3 = (uint)bVar1;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in1,(uint32_t)local_b8,(uint32_t)local_a8,in2,(uint32_t)local_b0,(uint32_t)local_a0,out
             ,(uint32_t)local_88,(uint32_t)local_90,width,local_c4);
  local_bc = width * uVar3;
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  local_58._data = (uchar *)0x0;
  local_58._type = in2->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)in2,src);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  local_80._data = (uchar *)0x0;
  local_80._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_80,(EVP_PKEY_CTX *)out,src_00);
  Image_Function::
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&local_bc,&local_c4,in1,&local_58,&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  rowSizeIn1 = in1->_rowSize;
  rowSizeIn2 = in2->_rowSize;
  rowSizeOut = out->_rowSize;
  simdWidth = local_bc / local_c0;
  outY = out->_data + (ulong)((int)local_88 * uVar3) + (ulong)((int)local_90 * rowSizeOut);
  if (SVar2 == sse_function) {
    sse::AbsoluteDifference
              (rowSizeIn1,rowSizeIn2,rowSizeOut,
               in1->_data + (ulong)((int)local_b8 * uVar3) + (ulong)((int)local_a8 * rowSizeIn1),
               in2->_data + (ulong)((int)local_b0 * uVar3) + (ulong)((int)local_a0 * rowSizeIn2),
               outY,outY + local_c4 * rowSizeOut,simdWidth,simdWidth * local_c0,local_bc % local_c0)
    ;
  }
  else if (SVar2 == avx_function) {
    avx::AbsoluteDifference
              (rowSizeIn1,rowSizeIn2,rowSizeOut,
               in1->_data + (ulong)((int)local_b8 * uVar3) + (ulong)((int)local_a8 * rowSizeIn1),
               in2->_data + (ulong)((int)local_b0 * uVar3) + (ulong)((int)local_a0 * rowSizeIn2),
               outY,outY + local_c4 * rowSizeOut,simdWidth,simdWidth * local_c0,local_bc % local_c0)
    ;
  }
  return;
}

Assistant:

void AbsoluteDifference( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                             Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height, SIMDType simdType )
    {
        const uint8_t colorCount = Image_Function::CommonColorCount( in1, in2, out );
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width * colorCount < simdSize) ) {
            AVX_CODE( AbsoluteDifference( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height, sse_function ); )

            Image_Function::AbsoluteDifference( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
            return;
        }

        Image_Function::ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
        width = width * colorCount;

        Image_Function::OptimiseRoi( width, height, in1, in2, out );

        const uint32_t rowSizeIn1 = in1.rowSize();
        const uint32_t rowSizeIn2 = in2.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * in1Y = in1.data() + startY1   * rowSizeIn1 + startX1   * colorCount;
        const uint8_t * in2Y = in2.data() + startY2   * rowSizeIn2 + startX2   * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::AbsoluteDifference( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::AbsoluteDifference( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::AbsoluteDifference( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }